

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valve.cpp
# Opt level: O0

double __thiscall Valve::getSetting(Valve *this,Network *nw)

{
  double dVar1;
  ValveType VVar2;
  double dVar3;
  Network *nw_local;
  Valve *this_local;
  
  VVar2 = this->valveType;
  if (PSV < VVar2) {
    if (VVar2 == FCV) {
      dVar1 = (this->super_Link).setting;
      dVar3 = Network::ucf(nw,FLOW);
      return dVar1 * dVar3;
    }
    if (VVar2 != PBV) {
      return (this->super_Link).setting;
    }
  }
  dVar1 = (this->super_Link).setting;
  dVar3 = Network::ucf(nw,PRESSURE);
  return dVar1 * dVar3;
}

Assistant:

double Valve::getSetting(Network* nw)
{
    switch(valveType)
    {
    case PRV:
    case PSV:
    case PBV: return setting * nw->ucf(Units::PRESSURE);
    case FCV: return setting * nw->ucf(Units::FLOW);
    default:  return setting;
    }
}